

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  undefined1 *puVar5;
  UnitTest *this;
  long lVar6;
  int local_2c;
  
  local_2c = argc;
  testing::InitGoogleTest(&local_2c,argv);
  bVar2 = 1 < local_2c;
  iVar3 = 0;
  if (1 < local_2c) {
    lVar6 = 1;
    do {
      if (*argv[lVar6] != '-') {
LAB_0012cd89:
        fprintf(_stderr,"Unknown option: %s\n");
        iVar3 = 1;
LAB_0012cda6:
        print_usage();
        break;
      }
      bVar1 = argv[lVar6][1];
      if (bVar1 < 0x68) {
        if (bVar1 == 99) {
          lVar4 = manifold::ManifoldParams();
          *(undefined1 *)(lVar4 + 1) = 1;
        }
        else {
          if (bVar1 != 0x65) goto LAB_0012cd89;
          puts("Export not possible because MANIFOLD_EXPORT compile flag is not set.");
          options.exportModels = true;
        }
      }
      else {
        if (bVar1 != 0x76) {
          if (bVar1 != 0x68) goto LAB_0012cd89;
          iVar3 = 0;
          goto LAB_0012cda6;
        }
        lVar4 = manifold::ManifoldParams();
        *(undefined4 *)(lVar4 + 8) = 1;
        if (argv[lVar6][2] == 'v') {
          lVar4 = manifold::ManifoldParams();
          *(undefined4 *)(lVar4 + 8) = 2;
        }
      }
      lVar6 = lVar6 + 1;
      bVar2 = lVar6 < local_2c;
      iVar3 = 0;
    } while (lVar6 < local_2c);
  }
  if (!bVar2) {
    puVar5 = (undefined1 *)manifold::ManifoldParams();
    *puVar5 = 1;
    lVar6 = manifold::ManifoldParams();
    *(undefined1 *)(lVar6 + 2) = 0;
    RegisterPolygonTests();
    this = testing::UnitTest::GetInstance();
    iVar3 = testing::UnitTest::Run(this);
  }
  return iVar3;
}

Assistant:

int main(int argc, char** argv) {
  ::testing::InitGoogleTest(&argc, argv);

  const char* name = "test setup";
  FrameMarkStart(name);

  // warmup tbb for emscripten, according to
  // https://github.com/oneapi-src/oneTBB/blob/master/WASM_Support.md#limitations
#if defined(__EMSCRIPTEN__) && (MANIFOLD_PAR == 1)
  int num_threads = tbb::this_task_arena::max_concurrency();
  std::atomic<int> barrier{num_threads};
  tbb::parallel_for(
      0, num_threads,
      [&barrier](int) {
        barrier--;
        while (barrier > 0) {
          // Send browser thread to event loop
          std::this_thread::yield();
        }
      },
      tbb::static_partitioner{});
#endif

  for (int i = 1; i < argc; i++) {
    if (argv[i][0] != '-') {
      fprintf(stderr, "Unknown option: %s\n", argv[i]);
      print_usage();
      return 1;
    }
    switch (argv[i][1]) {
      case 'h':
        print_usage();
        return 0;
      case 'e':
#ifndef MANIFOLD_EXPORT
        printf(
            "Export not possible because MANIFOLD_EXPORT compile flag is not "
            "set.\n");
#endif
        options.exportModels = true;
        break;
      case 'v':
        manifold::ManifoldParams().verbose = 1;
        if (argv[i][2] == 'v') {
          manifold::ManifoldParams().verbose = 2;
        }
        break;
      case 'c':
        manifold::ManifoldParams().selfIntersectionChecks = true;
        break;
      default:
        fprintf(stderr, "Unknown option: %s\n", argv[i]);
        print_usage();
        return 1;
    }
  }

  manifold::ManifoldParams().intermediateChecks = true;
  manifold::ManifoldParams().processOverlaps = false;

  FrameMarkEnd(name);

  RegisterPolygonTests();
  return RUN_ALL_TESTS();
}